

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_insert_face(REF_CAVITY ref_cavity,REF_INT *nodes)

{
  REF_DBL *pRVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  undefined8 in_RAX;
  long lVar5;
  REF_INT *pRVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  REF_BOOL reversed;
  undefined8 local_28;
  
  local_28 = in_RAX;
  uVar4 = ref_cavity_find_face
                    (ref_cavity,nodes,(REF_INT *)&local_28,(REF_BOOL *)((long)&local_28 + 4));
  if ((uVar4 == 0) || (uVar4 == 5)) {
    lVar5 = (long)(int)local_28;
    if (lVar5 == -1) {
      iVar9 = ref_cavity->blankface;
      if (iVar9 == -1) {
        iVar9 = ref_cavity->maxface;
        iVar7 = 100;
        if (100 < (int)((double)iVar9 * 1.5)) {
          iVar7 = (int)((double)iVar9 * 1.5);
        }
        ref_cavity->maxface = iVar7 + iVar9;
        fflush(_stdout);
        if (ref_cavity->maxface < 1) {
          pRVar6 = ref_cavity->f2n;
        }
        else {
          pRVar6 = (REF_INT *)realloc(ref_cavity->f2n,(ulong)(uint)ref_cavity->maxface * 0xc);
          ref_cavity->f2n = pRVar6;
        }
        if (pRVar6 == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x168,"ref_cavity_insert_face","realloc ref_cavity->f2n NULL");
          uVar2 = (long)ref_cavity->maxface * 3;
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",uVar2 & 0xffffffff,uVar2
                 ,4,(long)ref_cavity->maxface * 0xc);
          return 2;
        }
        iVar7 = ref_cavity->maxface;
        if (iVar9 < iVar7) {
          lVar5 = (long)iVar9;
          piVar8 = pRVar6 + lVar5 * 3 + 1;
          iVar3 = iVar9;
          do {
            iVar3 = iVar3 + 1;
            piVar8[-1] = -1;
            lVar5 = lVar5 + 1;
            *piVar8 = iVar3;
            iVar7 = ref_cavity->maxface;
            piVar8 = piVar8 + 3;
          } while (lVar5 < iVar7);
        }
        pRVar6[iVar7 * 3 + -2] = -1;
        ref_cavity->blankface = iVar9;
      }
      else {
        pRVar6 = ref_cavity->f2n;
      }
      ref_cavity->blankface = pRVar6[(long)(iVar9 * 3) + 1];
      lVar5 = 0;
      do {
        pRVar6[iVar9 * 3 + lVar5] = nodes[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      ref_cavity->nface = ref_cavity->nface + 1;
    }
    else {
      if (local_28._4_4_ == 0) {
        if (ref_cavity->debug == 0) {
          return 3;
        }
        pRVar1 = ref_cavity->ref_grid->node->real;
        lVar5 = (long)*nodes;
        printf("twice nodes[0] %f %f %f\n",pRVar1[lVar5 * 0xf],pRVar1[lVar5 * 0xf + 1],
               pRVar1[lVar5 * 0xf + 2]);
        pRVar1 = ref_cavity->ref_grid->node->real;
        lVar5 = (long)nodes[1];
        printf("twice nodes[1] %f %f %f\n",pRVar1[lVar5 * 0xf],pRVar1[lVar5 * 0xf + 1],
               pRVar1[lVar5 * 0xf + 2]);
        pRVar1 = ref_cavity->ref_grid->node->real;
        lVar5 = (long)nodes[2];
        printf("twice nodes[2] %f %f %f\n",pRVar1[lVar5 * 0xf],pRVar1[lVar5 * 0xf + 1],
               pRVar1[lVar5 * 0xf + 2]);
        ref_cavity_tec(ref_cavity,"cav-twice.tec");
        return 3;
      }
      pRVar6 = ref_cavity->f2n;
      pRVar6[lVar5 * 3] = -1;
      pRVar6[lVar5 * 3 + 1] = ref_cavity->blankface;
      ref_cavity->blankface = (int)local_28;
      ref_cavity->nface = ref_cavity->nface + -1;
    }
    uVar4 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x13c,
           "ref_cavity_insert_face",(ulong)uVar4,"find existing");
  }
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_insert_face(REF_CAVITY ref_cavity,
                                          REF_INT *nodes) {
  REF_INT node, face;
  REF_INT orig, chunk;
  REF_BOOL reversed;

  RXS(ref_cavity_find_face(ref_cavity, nodes, &face, &reversed), REF_NOT_FOUND,
      "find existing");

  if (REF_EMPTY != face) {
    if (reversed) { /* two faces with opposite orientation destroy each other */
      ref_cavity_f2n(ref_cavity, 0, face) = REF_EMPTY;
      ref_cavity_f2n(ref_cavity, 1, face) = ref_cavity_blankface(ref_cavity);
      ref_cavity_blankface(ref_cavity) = face;
      ref_cavity_nface(ref_cavity)--;
      return REF_SUCCESS;
    } else { /* can't happen, added same face twice */
      if (ref_cavity_debug(ref_cavity)) {
        printf("twice nodes[0] %f %f %f\n",
               ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 0,
                            nodes[0]),
               ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 1,
                            nodes[0]),
               ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 2,
                            nodes[0]));
        printf("twice nodes[1] %f %f %f\n",
               ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 0,
                            nodes[1]),
               ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 1,
                            nodes[1]),
               ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 2,
                            nodes[1]));
        printf("twice nodes[2] %f %f %f\n",
               ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 0,
                            nodes[2]),
               ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 1,
                            nodes[2]),
               ref_node_xyz(ref_grid_node(ref_cavity_grid(ref_cavity)), 2,
                            nodes[2]));
        ref_cavity_tec(ref_cavity, "cav-twice.tec");
      }
      return REF_INVALID;
    }
  }

  /* if I need to grow my array of faces */
  if (REF_EMPTY == ref_cavity_blankface(ref_cavity)) {
    orig = ref_cavity_maxface(ref_cavity);
    chunk = MAX(100, (REF_INT)(1.5 * (REF_DBL)orig));
    ref_cavity_maxface(ref_cavity) = orig + chunk;

    ref_realloc(ref_cavity->f2n, 3 * ref_cavity_maxface(ref_cavity), REF_INT);

    for (face = orig; face < ref_cavity_maxface(ref_cavity); face++) {
      ref_cavity_f2n(ref_cavity, 0, face) = REF_EMPTY;
      ref_cavity_f2n(ref_cavity, 1, face) = face + 1;
    }
    ref_cavity_f2n(ref_cavity, 1, (ref_cavity->maxface) - 1) = REF_EMPTY;
    ref_cavity_blankface(ref_cavity) = orig;
  }

  face = ref_cavity_blankface(ref_cavity);
  ref_cavity_blankface(ref_cavity) = ref_cavity_f2n(ref_cavity, 1, face);
  for (node = 0; node < 3; node++)
    ref_cavity_f2n(ref_cavity, node, face) = nodes[node];

  ref_cavity_nface(ref_cavity)++;

  return REF_SUCCESS;
}